

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::PrintLabelSummary(cmCTestTestHandler *this)

{
  _Rb_tree_node_base *__k;
  double dVar1;
  cmCTestTestProperties *pcVar2;
  cmCTest *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  mapped_type_conflict *pmVar5;
  mapped_type *pmVar6;
  pointer pbVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  cmCTestTestProperties *p;
  pointer pcVar10;
  pointer pcVar11;
  iterator l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  iterator l_1;
  pointer __k_00;
  ulong uVar12;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  char *local_7c0 [4];
  string label;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelCounts;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  labelTimes;
  ostringstream labelCountStr;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_1;
  
  pcVar10 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labelTimes._M_t._M_impl.super__Rb_tree_header._M_header;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labelCounts._M_t._M_impl.super__Rb_tree_header._M_header;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &labels._M_t._M_impl.super__Rb_tree_header._M_header;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar12 = 0;
  labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labelCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       labelTimes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; pcVar10 !=
         (this->TestList).
         super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
         ._M_impl.super__Vector_impl_data._M_finish; pcVar10 = pcVar10 + 1) {
    __v = (pcVar10->Labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (pcVar10->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__v != pbVar4) {
      for (; __v != pbVar4; __v = __v + 1) {
        if (uVar12 < __v->_M_string_length) {
          uVar12 = __v->_M_string_length;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&labels,__v);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](&labelTimes,__v);
        *pmVar5 = 0.0;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&labelCounts,__v);
        *pmVar6 = 0;
        pbVar4 = (pcVar10->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  for (pcVar11 = (this->TestResults).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pcVar11 !=
      (this->TestResults).
      super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
      ._M_impl.super__Vector_impl_data._M_finish; pcVar11 = pcVar11 + 1) {
    pcVar2 = pcVar11->Properties;
    __k_00 = (pcVar2->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar7 = (pcVar2->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__k_00 != pbVar7) {
      for (; __k_00 != pbVar7; __k_00 = __k_00 + 1) {
        dVar1 = pcVar11->ExecutionTime;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](&labelTimes,__k_00);
        *pmVar5 = dVar1 + *pmVar5;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&labelCounts,__k_00);
        *pmVar6 = *pmVar6 + 1;
        pbVar7 = (pcVar2->Labels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
  }
  if (labels._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"\nLabel Time Summary:");
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x296,_labelCountStr,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&labelCountStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  for (p_Var9 = labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &labels._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    __k = p_Var9 + 1;
    std::__cxx11::string::string((string *)&label,(string *)__k);
    std::__cxx11::string::resize((ulong)&label,(char)uVar12 + '\x03');
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&labelTimes,(key_type *)__k);
    sprintf((char *)&cmCTestLog_msg,"%6.2f sec",*pmVar5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&labelCountStr);
    poVar8 = std::operator<<((ostream *)&labelCountStr,"(");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&labelCounts,(key_type *)__k);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pmVar6);
    std::operator<<(poVar8," test");
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&labelCounts,(key_type *)__k);
    if (1 < *pmVar6) {
      std::operator<<((ostream *)&labelCountStr,"s");
    }
    std::operator<<((ostream *)&labelCountStr,")");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_1,"\n");
    poVar8 = std::operator<<(poVar8,(string *)&label);
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::operator<<(poVar8,(char *)&cmCTestLog_msg);
    poVar8 = std::operator<<(poVar8," ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar8,(string *)local_7c0);
    std::__cxx11::string::~string((string *)local_7c0);
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x2aa,local_7c0[0],(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)local_7c0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    if (this->LogFile != (ostream *)0x0) {
      poVar8 = std::operator<<(this->LogFile,"\n");
      poVar8 = std::operator<<(poVar8,(string *)__k);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,(char *)&cmCTestLog_msg);
      std::operator<<(poVar8,"\n");
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&labelCountStr);
    std::__cxx11::string::~string((string *)&label);
  }
  if (labels._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    if (this->LogFile != (ostream *)0x0) {
      std::operator<<(this->LogFile,"\n");
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"\n");
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x2b3,_labelCountStr,(this->super_cmCTestGenericHandler).Quiet);
    std::__cxx11::string::~string((string *)&labelCountStr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&labels._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&labelCounts._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~_Rb_tree(&labelTimes._M_t);
  return;
}

Assistant:

void cmCTestTestHandler::PrintLabelSummary()
{
  cmCTestTestHandler::ListOfTests::iterator it = this->TestList.begin();
  std::map<std::string, double> labelTimes;
  std::map<std::string, int> labelCounts;
  std::set<std::string> labels;
  // initialize maps
  std::string::size_type maxlen = 0;
  for (; it != this->TestList.end(); ++it) {
    cmCTestTestProperties& p = *it;
    if (!p.Labels.empty()) {
      for (std::vector<std::string>::iterator l = p.Labels.begin();
           l != p.Labels.end(); ++l) {
        if ((*l).size() > maxlen) {
          maxlen = (*l).size();
        }
        labels.insert(*l);
        labelTimes[*l] = 0;
        labelCounts[*l] = 0;
      }
    }
  }
  cmCTestTestHandler::TestResultsVector::iterator ri =
    this->TestResults.begin();
  // fill maps
  for (; ri != this->TestResults.end(); ++ri) {
    cmCTestTestResult& result = *ri;
    cmCTestTestProperties& p = *result.Properties;
    if (!p.Labels.empty()) {
      for (std::vector<std::string>::iterator l = p.Labels.begin();
           l != p.Labels.end(); ++l) {
        labelTimes[*l] += result.ExecutionTime;
        ++labelCounts[*l];
      }
    }
  }
  // now print times
  if (!labels.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "\nLabel Time Summary:",
                       this->Quiet);
  }
  for (std::set<std::string>::const_iterator i = labels.begin();
       i != labels.end(); ++i) {
    std::string label = *i;
    label.resize(maxlen + 3, ' ');

    char buf[1024];
    sprintf(buf, "%6.2f sec", labelTimes[*i]);

    std::ostringstream labelCountStr;
    labelCountStr << "(" << labelCounts[*i] << " test";
    if (labelCounts[*i] > 1) {
      labelCountStr << "s";
    }
    labelCountStr << ")";

    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "\n"
                         << label << " = " << buf << " "
                         << labelCountStr.str(),
                       this->Quiet);
    if (this->LogFile) {
      *this->LogFile << "\n" << *i << " = " << buf << "\n";
    }
  }
  if (!labels.empty()) {
    if (this->LogFile) {
      *this->LogFile << "\n";
    }
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "\n", this->Quiet);
  }
}